

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_12c9941::MemPoolAccept::Finalize
          (MemPoolAccept *this,ATMPArgs *args,Workspace *ws)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  setEntries *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Txid *this_01;
  element_type *peVar4;
  long *plVar5;
  CTxMemPoolEntry *pCVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  CTxMemPool *pool;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  string_view source_file;
  bool bVar12;
  bool bVar13;
  Logger *pLVar14;
  int64_t iVar15;
  _List_node_base *p_Var16;
  _Base_ptr p_Var17;
  CCoinsViewCache *coins_cache;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  int *in_stack_fffffffffffffe58;
  undefined4 local_16c;
  undefined4 local_168 [2];
  string log_msg;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8 [3];
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = ws->m_hash;
  bVar13 = args->m_bypass_limits;
  p_Var17 = (this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_left;
  p_Var1 = &(this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var17 != p_Var1) {
    peVar4 = (ws->m_ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    do {
      plVar5 = *(long **)(p_Var17 + 1);
      pLVar14 = LogInstance();
      bVar12 = BCLog::Logger::WillLogCategoryLevel(pLVar14,MEMPOOL,Debug);
      if (bVar12) {
        base_blob<256u>::ToString_abi_cxx11_(local_d8,(void *)(*plVar5 + 0x39));
        base_blob<256u>::ToString_abi_cxx11_(&local_f8,(void *)(*plVar5 + 0x59));
        iVar15 = GetVirtualTransactionSize((long)(int)plVar5[0xf],plVar5[0x14],nBytesPerSigOp);
        local_168[0] = (undefined4)iVar15;
        base_blob<256u>::ToString_abi_cxx11_(&local_118,this_01);
        base_blob<256u>::ToString_abi_cxx11_(&local_138,&peVar4->m_witness_hash);
        pCVar6 = (ws->m_entry)._M_t.
                 super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>._M_t.
                 super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>.
                 super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl;
        iVar15 = GetVirtualTransactionSize((long)pCVar6->nTxWeight,pCVar6->sigOpCost,nBytesPerSigOp)
        ;
        local_16c = (undefined4)iVar15;
        pLVar14 = LogInstance();
        bVar12 = BCLog::Logger::Enabled(pLVar14);
        if (bVar12) {
          log_msg._M_dataplus._M_p._0_1_ = SUB81(&log_msg.field_2,0);
          log_msg._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&log_msg.field_2 >> 8);
          log_msg._M_string_length._0_1_ = 0;
          log_msg._M_string_length._1_7_ = 0;
          log_msg.field_2._M_local_buf[0] = '\0';
          tinyformat::
          format<std::__cxx11::string,std::__cxx11::string,long,int,std::__cxx11::string,std::__cxx11::string,long,int>
                    (&local_58,
                     (tinyformat *)
                     "replacing mempool tx %s (wtxid=%s, fees=%s, vsize=%s). New tx %s (wtxid=%s, fees=%s, vsize=%s)\n"
                     ,(char *)local_d8,&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (plVar5 + 0xe),(long *)local_168,(int *)&local_118,&local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &pCVar6->nFee,(long *)&local_16c,in_stack_fffffffffffffe58);
          _GLOBAL__N_1::MemPoolAccept::Finalize();
          pLVar14 = LogInstance();
          str._M_str._1_7_ = log_msg._M_dataplus._M_p._1_7_;
          str._M_str._0_1_ = log_msg._M_dataplus._M_p._0_1_;
          str._M_len._1_7_ = log_msg._M_string_length._1_7_;
          str._M_len._0_1_ = (undefined1)log_msg._M_string_length;
          local_78._M_dataplus._M_p = (pointer)0x57;
          local_78._M_string_length = 0x84a7d9;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file._M_len = 0x57;
          logging_function._M_str = "Finalize";
          logging_function._M_len = 8;
          BCLog::Logger::LogPrintStr(pLVar14,str,logging_function,source_file,0x522,MEMPOOL,Debug);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(log_msg._M_dataplus._M_p._1_7_,log_msg._M_dataplus._M_p._0_1_) !=
              &log_msg.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(log_msg._M_dataplus._M_p._1_7_,log_msg._M_dataplus._M_p._0_1_),
                            CONCAT71(log_msg.field_2._M_allocated_capacity._1_7_,
                                     log_msg.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
          operator_delete(local_d8[0]._M_dataplus._M_p,local_d8[0].field_2._M_allocated_capacity + 1
                         );
        }
      }
      p_Var7 = (_List_node_base *)*plVar5;
      p_Var8 = (_List_node_base *)plVar5[1];
      if (p_Var8 != (_List_node_base *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var8->_M_prev = *(int *)&p_Var8->_M_prev + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var8->_M_prev = *(int *)&p_Var8->_M_prev + 1;
        }
      }
      p_Var16 = (_List_node_base *)operator_new(0x20);
      p_Var16[1]._M_next = p_Var7;
      p_Var16[1]._M_prev = p_Var8;
      std::__detail::_List_node_base::_M_hook(p_Var16);
      psVar2 = &(this->m_subpackage).m_replaced_transactions.
                super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl._M_node._M_size;
      *psVar2 = *psVar2 + 1;
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17);
    } while ((_Rb_tree_header *)p_Var17 != p_Var1);
  }
  this_00 = &(this->m_subpackage).m_all_conflicts;
  CTxMemPool::RemoveStaged(this->m_pool,this_00,false,REPLACED);
  std::_Rb_tree<$270907ca$>::clear(&this_00->_M_t);
  CTxMemPool::addUnchecked
            (this->m_pool,
             (ws->m_entry)._M_t.
             super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>.
             super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl,&ws->m_ancestors);
  bVar12 = true;
  if ((args->m_package_submission == false) && (bVar13 == false)) {
    pool = this->m_pool;
    coins_cache = Chainstate::CoinsTip(this->m_active_chainstate);
    LimitMempoolSize(pool,coins_cache);
    log_msg._M_dataplus._M_p._0_1_ = 0;
    uVar9 = *(undefined8 *)(this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems;
    uVar10 = *(undefined8 *)((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
    uVar11 = *(undefined8 *)((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
    unique0x10000423 =
         *(undefined8 *)((this_01->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
    log_msg._M_dataplus._M_p._1_7_ = (undefined7)uVar9;
    log_msg._M_string_length._0_1_ = (undefined1)((ulong)uVar9 >> 0x38);
    log_msg._M_string_length._1_7_ = (undefined7)uVar10;
    log_msg.field_2._M_local_buf[0] = (char)((ulong)uVar10 >> 0x38);
    log_msg.field_2._M_allocated_capacity._1_7_ = (undefined7)uVar11;
    log_msg.field_2._M_local_buf[8] = (char)((ulong)uVar11 >> 0x38);
    bVar13 = CTxMemPool::exists(this->m_pool,(GenTxid *)&log_msg);
    if (!bVar13) {
      paVar3 = &log_msg.field_2;
      log_msg._M_dataplus._M_p._0_1_ = SUB81(paVar3,0);
      log_msg._M_dataplus._M_p._1_7_ = (undefined7)((ulong)paVar3 >> 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&log_msg,"mempool full","");
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
      bVar12 = ValidationState<TxValidationResult>::Invalid
                         (&(ws->m_state).super_ValidationState<TxValidationResult>,TX_RECONSIDERABLE
                          ,&log_msg,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(log_msg._M_dataplus._M_p._1_7_,log_msg._M_dataplus._M_p._0_1_) != paVar3) {
        operator_delete((undefined1 *)
                        CONCAT71(log_msg._M_dataplus._M_p._1_7_,log_msg._M_dataplus._M_p._0_1_),
                        CONCAT71(log_msg.field_2._M_allocated_capacity._1_7_,
                                 log_msg.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar12;
}

Assistant:

bool MemPoolAccept::Finalize(const ATMPArgs& args, Workspace& ws)
{
    AssertLockHeld(cs_main);
    AssertLockHeld(m_pool.cs);
    const CTransaction& tx = *ws.m_ptx;
    const uint256& hash = ws.m_hash;
    TxValidationState& state = ws.m_state;
    const bool bypass_limits = args.m_bypass_limits;
    std::unique_ptr<CTxMemPoolEntry>& entry = ws.m_entry;

    if (!m_subpackage.m_all_conflicts.empty()) Assume(args.m_allow_replacement);
    // Remove conflicting transactions from the mempool
    for (CTxMemPool::txiter it : m_subpackage.m_all_conflicts)
    {
        LogDebug(BCLog::MEMPOOL, "replacing mempool tx %s (wtxid=%s, fees=%s, vsize=%s). New tx %s (wtxid=%s, fees=%s, vsize=%s)\n",
                it->GetTx().GetHash().ToString(),
                it->GetTx().GetWitnessHash().ToString(),
                it->GetFee(),
                it->GetTxSize(),
                hash.ToString(),
                tx.GetWitnessHash().ToString(),
                entry->GetFee(),
                entry->GetTxSize());
        TRACE7(mempool, replaced,
                it->GetTx().GetHash().data(),
                it->GetTxSize(),
                it->GetFee(),
                std::chrono::duration_cast<std::chrono::duration<std::uint64_t>>(it->GetTime()).count(),
                hash.data(),
                entry->GetTxSize(),
                entry->GetFee()
        );
        m_subpackage.m_replaced_transactions.push_back(it->GetSharedTx());
    }
    m_pool.RemoveStaged(m_subpackage.m_all_conflicts, false, MemPoolRemovalReason::REPLACED);
    // Don't attempt to process the same conflicts repeatedly during subpackage evaluation:
    // they no longer exist on subsequent calls to Finalize() post-RemoveStaged
    m_subpackage.m_all_conflicts.clear();
    // Store transaction in memory
    m_pool.addUnchecked(*entry, ws.m_ancestors);

    // trim mempool and check if tx was trimmed
    // If we are validating a package, don't trim here because we could evict a previous transaction
    // in the package. LimitMempoolSize() should be called at the very end to make sure the mempool
    // is still within limits and package submission happens atomically.
    if (!args.m_package_submission && !bypass_limits) {
        LimitMempoolSize(m_pool, m_active_chainstate.CoinsTip());
        if (!m_pool.exists(GenTxid::Txid(hash)))
            // The tx no longer meets our (new) mempool minimum feerate but could be reconsidered in a package.
            return state.Invalid(TxValidationResult::TX_RECONSIDERABLE, "mempool full");
    }
    return true;
}